

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * cmSplitExtension(string *__return_storage_ptr__,string *in,string *base)

{
  string local_80 [32];
  string local_60 [48];
  long local_30;
  size_type dot_pos;
  string *local_20;
  string *base_local;
  string *in_local;
  string *ext;
  
  dot_pos._7_1_ = 0;
  local_20 = base;
  base_local = in;
  in_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = std::__cxx11::string::rfind((char *)base_local,0x8f3aae);
  if (local_30 == -1) {
    std::__cxx11::string::operator=((string *)local_20,(string *)base_local);
  }
  else {
    std::__cxx11::string::substr((ulong)local_60,(ulong)base_local);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::substr((ulong)local_80,(ulong)base_local);
    std::__cxx11::string::operator=((string *)local_20,local_80);
    std::__cxx11::string::~string(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSplitExtension(std::string const& in, std::string& base)
{
  std::string ext;
  std::string::size_type dot_pos = in.rfind(".");
  if(dot_pos != std::string::npos)
    {
    // Remove the extension first in case &base == &in.
    ext = in.substr(dot_pos, std::string::npos);
    base = in.substr(0, dot_pos);
    }
  else
    {
    base = in;
    }
  return ext;
}